

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_6tap_16x2_half_pel_avx2
               (int16_t *src,ptrdiff_t stride,__m256i *s_256,__m256i *ss_256,__m256i *coeffs,
               __m256i *r)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  long in_RSI;
  long in_RDI;
  __m256i a_256 [2];
  
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 10);
  uVar5 = puVar1[1];
  uVar6 = puVar1[2];
  uVar7 = puVar1[3];
  *(undefined8 *)in_RDX[5] = *puVar1;
  *(undefined8 *)(in_RDX[5] + 8) = uVar5;
  *(undefined8 *)(in_RDX[5] + 0x10) = uVar6;
  *(undefined8 *)(in_RDX[5] + 0x18) = uVar7;
  auVar2 = vpaddw_avx2(*in_RDX,in_RDX[5]);
  auVar3 = vpaddw_avx2(in_RDX[1],in_RDX[4]);
  auVar4 = vpunpcklwd_avx2(auVar2,auVar3);
  *in_RCX = auVar4;
  auVar4 = vpunpcklwd_avx2(in_RDX[2],in_RDX[3]);
  in_RCX[1] = auVar4;
  auVar3 = vpunpckhwd_avx2(auVar2,auVar3);
  in_RCX[2] = auVar3;
  auVar3 = vpunpckhwd_avx2(in_RDX[2],in_RDX[3]);
  in_RCX[3] = auVar3;
  xy_y_convolve_4tap_16_avx2(auVar2._8_8_,auVar2._0_8_,(__m256i *)0x9a8950);
  auVar2 = vpaddw_avx2(in_RDX[2],in_RDX[5]);
  uVar5 = *(undefined8 *)(in_RDX[2] + 8);
  uVar6 = *(undefined8 *)(in_RDX[2] + 0x10);
  uVar7 = *(undefined8 *)(in_RDX[2] + 0x18);
  *(undefined8 *)*in_RDX = *(undefined8 *)in_RDX[2];
  *(undefined8 *)(*in_RDX + 8) = uVar5;
  *(undefined8 *)(*in_RDX + 0x10) = uVar6;
  *(undefined8 *)(*in_RDX + 0x18) = uVar7;
  uVar5 = *(undefined8 *)(in_RDX[4] + 8);
  uVar6 = *(undefined8 *)(in_RDX[4] + 0x10);
  uVar7 = *(undefined8 *)(in_RDX[4] + 0x18);
  *(undefined8 *)in_RDX[2] = *(undefined8 *)in_RDX[4];
  *(undefined8 *)(in_RDX[2] + 8) = uVar5;
  *(undefined8 *)(in_RDX[2] + 0x10) = uVar6;
  *(undefined8 *)(in_RDX[2] + 0x18) = uVar7;
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 0xc);
  uVar5 = puVar1[1];
  uVar6 = puVar1[2];
  uVar7 = puVar1[3];
  *(undefined8 *)in_RDX[4] = *puVar1;
  *(undefined8 *)(in_RDX[4] + 8) = uVar5;
  *(undefined8 *)(in_RDX[4] + 0x10) = uVar6;
  *(undefined8 *)(in_RDX[4] + 0x18) = uVar7;
  auVar3 = vpaddw_avx2(in_RDX[1],in_RDX[4]);
  uVar5 = *(undefined8 *)(in_RDX[3] + 8);
  uVar6 = *(undefined8 *)(in_RDX[3] + 0x10);
  uVar7 = *(undefined8 *)(in_RDX[3] + 0x18);
  *(undefined8 *)in_RDX[1] = *(undefined8 *)in_RDX[3];
  *(undefined8 *)(in_RDX[1] + 8) = uVar5;
  *(undefined8 *)(in_RDX[1] + 0x10) = uVar6;
  *(undefined8 *)(in_RDX[1] + 0x18) = uVar7;
  uVar5 = *(undefined8 *)(in_RDX[5] + 8);
  uVar6 = *(undefined8 *)(in_RDX[5] + 0x10);
  uVar7 = *(undefined8 *)(in_RDX[5] + 0x18);
  *(undefined8 *)in_RDX[3] = *(undefined8 *)in_RDX[5];
  *(undefined8 *)(in_RDX[3] + 8) = uVar5;
  *(undefined8 *)(in_RDX[3] + 0x10) = uVar6;
  *(undefined8 *)(in_RDX[3] + 0x18) = uVar7;
  auVar4 = vpunpcklwd_avx2(auVar3,auVar2);
  *in_RCX = auVar4;
  auVar4 = vpunpcklwd_avx2(in_RDX[1],in_RDX[2]);
  in_RCX[1] = auVar4;
  auVar2 = vpunpckhwd_avx2(auVar3,auVar2);
  in_RCX[2] = auVar2;
  auVar2 = vpunpckhwd_avx2(in_RDX[1],in_RDX[2]);
  in_RCX[3] = auVar2;
  xy_y_convolve_4tap_16_avx2(auVar3._8_8_,auVar3._0_8_,(__m256i *)0x9a8b59);
  return;
}

Assistant:

static inline void xy_y_convolve_6tap_16x2_half_pel_avx2(
    const int16_t *const src, const ptrdiff_t stride, __m256i s_256[6],
    __m256i ss_256[4], const __m256i coeffs[2], __m256i r[4]) {
  __m256i a_256[2];

  s_256[5] = _mm256_loadu_si256((__m256i *)(src + 5 * stride));
  a_256[0] = _mm256_add_epi16(s_256[0], s_256[5]);
  a_256[1] = _mm256_add_epi16(s_256[1], s_256[4]);
  ss_256[0] = _mm256_unpacklo_epi16(a_256[0], a_256[1]);
  ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
  ss_256[2] = _mm256_unpackhi_epi16(a_256[0], a_256[1]);
  ss_256[3] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);
  xy_y_convolve_4tap_16_avx2(ss_256, coeffs, r + 0);

  a_256[1] = _mm256_add_epi16(s_256[2], s_256[5]);
  s_256[0] = s_256[2];
  s_256[2] = s_256[4];
  s_256[4] = _mm256_loadu_si256((__m256i *)(src + 6 * stride));
  a_256[0] = _mm256_add_epi16(s_256[1], s_256[4]);
  s_256[1] = s_256[3];
  s_256[3] = s_256[5];
  ss_256[0] = _mm256_unpacklo_epi16(a_256[0], a_256[1]);
  ss_256[1] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
  ss_256[2] = _mm256_unpackhi_epi16(a_256[0], a_256[1]);
  ss_256[3] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);
  xy_y_convolve_4tap_16_avx2(ss_256, coeffs, r + 2);
}